

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O0

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  bool bVar1;
  const_reference pvVar2;
  reference this_00;
  reference pvVar3;
  pointer this_01;
  iterator __first;
  iterator __last;
  float fVar4;
  _tess_edge_points *edge_points;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
  local_b0;
  _tess_edges_iterator edges_iterator_1;
  undefined1 local_a0 [8];
  _tess_edge new_edge;
  _tess_edge *edge;
  _tess_edge *local_58;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
  local_50;
  _tess_edges_iterator edges_iterator;
  _tess_coordinate_cartesian local_38;
  _tess_coordinate_cartesian new_item;
  float *coordinate;
  uint n_vertex;
  _run *run_local;
  TessellationShaderVertexSpacing *this_local;
  _tess_edges *result;
  
  std::
  vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  ::vector(__return_storage_ptr__);
  coordinate._0_4_ = 0;
  do {
    if (run->n_vertices <= (uint)coordinate) {
      local_b0._M_current =
           (_tess_edge *)
           std::
           vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
           ::begin(__return_storage_ptr__);
      while( true ) {
        edge_points = (_tess_edge_points *)
                      std::
                      vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                      ::end(__return_storage_ptr__);
        bVar1 = __gnu_cxx::operator!=
                          (&local_b0,
                           (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
                            *)&edge_points);
        if (!bVar1) break;
        this_01 = __gnu_cxx::
                  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
                  ::operator->(&local_b0);
        __first = std::
                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  ::begin(&this_01->points);
        __last = std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::end(&this_01->points);
        std::
        sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,bool(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>
                  ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                    )__first._M_current,
                   (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                    )__last._M_current,compareEdgeByX);
        __gnu_cxx::
        __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
        ::operator++(&local_b0);
      }
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&run->data,0);
    new_item = (_tess_coordinate_cartesian)((long)pvVar2 + (ulong)((uint)coordinate * 3) * 4);
    _tess_coordinate_cartesian::_tess_coordinate_cartesian(&local_38);
    local_38.x = *(float *)new_item;
    local_38.y = *(float *)((long)new_item + 4);
    __gnu_cxx::
    __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
    ::__normal_iterator(&local_50);
    local_58 = (_tess_edge *)
               std::
               vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
               ::begin(__return_storage_ptr__);
    local_50._M_current = local_58;
    while( true ) {
      edge = (_tess_edge *)
             std::
             vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
             ::end(__return_storage_ptr__);
      bVar1 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
                          *)&edge);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
                ::operator*(&local_50);
      pvVar3 = std::
               vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
               ::operator[](&this_00->points,0);
      fVar4 = de::abs<float>(pvVar3->y - *(float *)((long)new_item + 4));
      if (fVar4 < 0.001) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ::push_back(&this_00->points,&local_38);
        break;
      }
      __gnu_cxx::
      __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
      ::operator++(&local_50,0);
    }
    new_edge._32_8_ =
         std::
         vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
         ::end(__return_storage_ptr__);
    bVar1 = __gnu_cxx::operator==
                      (&local_50,
                       (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
                        *)&new_edge.tess_level);
    if (bVar1) {
      edges_iterator_1._M_current._4_4_ = 0x3f800000;
      _tess_edge::_tess_edge
                ((_tess_edge *)local_a0,run->outer + 1,run->outer + 1,
                 (float *)((long)&edges_iterator_1._M_current + 4));
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)local_a0,&local_38);
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_a0);
      _tess_edge::~_tess_edge((_tess_edge *)local_a0);
    }
    coordinate._0_4_ = (uint)coordinate + 1;
  } while( true );
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First convert the array data to a vector of edges, where each edge
	 * is a vector of points with the same V component. After this is done,
	 * points for each edge need to be sorted by U component.
	 */
	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		/* Isolines are simple - we only need to create a new edge per each unique height */
		const float*			   coordinate = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;
		_tess_coordinate_cartesian new_item;

		new_item.x = coordinate[0];
		new_item.y = coordinate[1];

		/* Is V recognized? */
		_tess_edges_iterator edges_iterator;

		for (edges_iterator = result.begin(); edges_iterator != result.end(); edges_iterator++)
		{
			_tess_edge& edge = *edges_iterator;

			/* Each edge uses the same Y component, so we only need to check the first entry */
			if (de::abs(edge.points[0].y - coordinate[1]) < epsilon)
			{
				/* Add the new point to the vector */
				edge.points.push_back(new_item);

				break;
			}
		} /* for (all edges) */

		if (edges_iterator == result.end())
		{
			/* New edge starts at this point.
			 *
			 * Note that outermost tessellation level does not apply to this
			 * primitive mode.
			 **/
			_tess_edge new_edge(run.outer[1], run.outer[1], 1.0f);

			new_edge.points.push_back(new_item);

			result.push_back(new_edge);
		}
	} /* for (all vertices) */

	/* For each edge, sort the points by U coordinate */
	for (_tess_edges_iterator edges_iterator = result.begin(); edges_iterator != result.end(); ++edges_iterator)
	{
		_tess_edge_points& edge_points = edges_iterator->points;

		std::sort(edge_points.begin(), edge_points.end(), compareEdgeByX);
	}

	/* Done */
	return result;
}